

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall dg::llvmdg::legacy::GraphBuilder::~GraphBuilder(GraphBuilder *this)

{
  Function *this_00;
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (Function *)p_Var1[1]._M_parent;
    if (this_00 != (Function *)0x0) {
      Function::~Function(this_00);
    }
    operator_delete(this_00,0x40);
  }
  std::
  _Hashtable<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->_mapping)._M_h);
  std::
  _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  ::_M_erase(&(this->_functions)._M_t,
             (_Link_type)(this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

GraphBuilder::~GraphBuilder() {
    for (auto function : _functions) {
        delete function.second;
    }
}